

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O3

void __thiscall tinyusdz::ascii::AsciiParser::AsciiParser(AsciiParser *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  this->_sr = (StreamReader *)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->_path_stack,0);
  (this->_curr_cursor).row = 0;
  (this->_curr_cursor).col = 0;
  p_Var1 = &(this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_prim_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_supported_api_schemas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_supported_stage_metas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_supported_prim_metas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_supported_prop_metas)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->err_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  ::std::
  _Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ::_M_initialize_map((_Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                       *)&this->err_stack,0);
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->warn_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::
  _Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
  ::_M_initialize_map((_Deque_base<tinyusdz::ascii::AsciiParser::ErrorDiagnostic,_std::allocator<tinyusdz::ascii::AsciiParser::ErrorDiagnostic>_>
                       *)&this->warn_stack,0);
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  ::std::
  _Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
  ::_M_initialize_map((_Deque_base<tinyusdz::ascii::AsciiParser::ParseState,_std::allocator<tinyusdz::ascii::AsciiParser::ParseState>_>
                       *)&this->parse_stack,0);
  this->_version = 1.0;
  this->_toplevel = true;
  this->_sub_layered = false;
  this->_referenced = false;
  this->_payloaded = false;
  (this->_option).allow_unknown_prim = true;
  (this->_option).allow_unknown_apiSchema = true;
  (this->_option).strict_allowedToken_check = false;
  (this->_base_dir)._M_dataplus._M_p = (pointer)&(this->_base_dir).field_2;
  (this->_base_dir)._M_string_length = 0;
  (this->_base_dir).field_2._M_local_buf[0] = '\0';
  (this->_stage_metas).subLayers.
  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stage_metas).subLayers.
  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stage_metas).subLayers.
  super__Vector_base<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_stage_metas).defaultPrim.str_._M_dataplus._M_p =
       (pointer)&(this->_stage_metas).defaultPrim.str_.field_2;
  (this->_stage_metas).defaultPrim.str_._M_string_length = 0;
  (this->_stage_metas).defaultPrim.str_.field_2._M_local_buf[0] = '\0';
  (this->_stage_metas).doc.value._M_dataplus._M_p = (pointer)&(this->_stage_metas).doc.value.field_2
  ;
  (this->_stage_metas).doc.value._M_string_length = 0;
  (this->_stage_metas).doc.value.field_2._M_local_buf[0] = '\0';
  (this->_stage_metas).doc.is_triple_quoted = false;
  (this->_stage_metas).doc.single_quote = false;
  (this->_stage_metas).doc.line_row = 0;
  (this->_stage_metas).doc.line_col = 0;
  (this->_stage_metas).upAxis.has_value_ = false;
  (this->_stage_metas).upAxis.contained = (storage_t<tinyusdz::Axis>)0x0;
  (this->_stage_metas).metersPerUnit.has_value_ = false;
  (this->_stage_metas).metersPerUnit.contained = (storage_t<double>)0x0;
  (this->_stage_metas).kilogramsPerUnit.has_value_ = false;
  (this->_stage_metas).kilogramsPerUnit.contained = (storage_t<double>)0x0;
  (this->_stage_metas).timeCodesPerSecond.has_value_ = false;
  (this->_stage_metas).timeCodesPerSecond.contained = (storage_t<double>)0x0;
  (this->_stage_metas).startTimeCode.has_value_ = false;
  (this->_stage_metas).startTimeCode.contained = (storage_t<double>)0x0;
  (this->_stage_metas).endTimeCode.has_value_ = false;
  (this->_stage_metas).endTimeCode.contained = (storage_t<double>)0x0;
  (this->_stage_metas).framesPerSecond.has_value_ = false;
  (this->_stage_metas).framesPerSecond.contained = (storage_t<double>)0x0;
  (this->_stage_metas).autoPlay.has_value_ = false;
  (this->_stage_metas).autoPlay.contained = (storage_t<bool>)0x0;
  (this->_stage_metas).playbackMode.has_value_ = false;
  *(undefined8 *)((long)&(this->_stage_metas).playbackMode.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_stage_metas).playbackMode.contained + 0x18) = 0;
  *(undefined8 *)&(this->_stage_metas).playbackMode.contained = 0;
  *(undefined8 *)((long)&(this->_stage_metas).playbackMode.contained + 8) = 0;
  p_Var2 = &(this->_stage_metas).customLayerData._M_t._M_impl.super__Rb_tree_header;
  (this->_stage_metas).customLayerData._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->_stage_metas).customLayerData._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_stage_metas).customLayerData._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->_stage_metas).customLayerData._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_stage_metas).customLayerData._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_stage_metas).comment.value._M_dataplus._M_p =
       (pointer)&(this->_stage_metas).comment.value.field_2;
  (this->_stage_metas).comment.value._M_string_length = 0;
  (this->_stage_metas).comment.value.field_2._M_local_buf[0] = '\0';
  (this->_stage_metas).comment.is_triple_quoted = false;
  (this->_stage_metas).comment.single_quote = false;
  (this->_stage_metas).comment.line_row = 0;
  (this->_stage_metas).comment.line_col = 0;
  p_Var2 = &(this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->_prim_idx_assign_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_prim_idx_assign_fun).super__Function_base._M_functor + 8) = 0;
  (this->_prim_idx_assign_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_prim_idx_assign_fun)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->_stage_meta_process_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_stage_meta_process_fun).super__Function_base._M_functor + 8) = 0;
  (this->_stage_meta_process_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_stage_meta_process_fun)._M_invoker = (_Invoker_type)0x0;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->_post_prim_construct_fun_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_primspec_mode = false;
  *(undefined8 *)&(this->_primspec_fun).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->_primspec_fun).super__Function_base._M_functor + 8) = 0;
  (this->_primspec_fun).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->_primspec_fun)._M_invoker = (_Invoker_type)0x0;
  Setup(this);
  return;
}

Assistant:

AsciiParser::AsciiParser() { Setup(); }